

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O3

vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> * __thiscall
tinyusdz::lerp<std::array<float,4ul>>
          (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
           *__return_storage_ptr__,tinyusdz *this,
          vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *a,
          vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *b,double t)

{
  float *pfVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  pointer paVar6;
  ulong uVar7;
  long lVar8;
  ulong __new_size;
  float fVar9;
  float fVar10;
  
  (__return_storage_ptr__->
  super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar7 = *(long *)(this + 8) - *(long *)this >> 4;
  __new_size = (long)(a->
                     super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(a->
                     super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 4;
  if (uVar7 <= __new_size) {
    __new_size = uVar7;
  }
  if (__new_size != 0) {
    std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::resize
              (__return_storage_ptr__,__new_size);
    if (*(long *)(this + 8) - *(long *)this ==
        (long)(a->
              super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>).
              _M_impl.super__Vector_impl_data._M_start) {
      fVar9 = (float)(1.0 - t);
      fVar10 = (float)t;
      lVar8 = 8;
      do {
        paVar6 = (a->
                 super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar2 = *(undefined8 *)(*(long *)this + -8 + lVar8);
        uVar3 = *(undefined8 *)(*(long *)this + lVar8);
        uVar4 = *(undefined8 *)((long)paVar6->_M_elems + lVar8 + -8);
        uVar5 = *(undefined8 *)((long)paVar6->_M_elems + lVar8);
        pfVar1 = (float *)((long)((__return_storage_ptr__->
                                  super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar8 + -8
                          );
        *pfVar1 = (float)uVar4 * fVar10 + (float)uVar2 * fVar9;
        pfVar1[1] = (float)((ulong)uVar4 >> 0x20) * fVar10 + (float)((ulong)uVar2 >> 0x20) * fVar9;
        pfVar1[2] = (float)uVar5 * fVar10 + (float)uVar3 * fVar9;
        pfVar1[3] = (float)((ulong)uVar5 >> 0x20) * fVar10 + (float)((ulong)uVar3 >> 0x20) * fVar9;
        lVar8 = lVar8 + 0x10;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}